

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O3

CNscPStackEntry * NscBuildReturn(CNscPStackEntry *pReturn)

{
  NscType NVar1;
  CNwnDoubleLinkList *pCVar2;
  CNscPStackEntry *pCVar3;
  CNscPStackEntry *this;
  NscSymbolFence *pNVar4;
  CNwnDoubleLinkList *pNext;
  NscType nType;
  NscMessage nMessage;
  CNwnDoubleLinkList *pCVar5;
  CNscContext *pCVar6;
  uchar *pauchData;
  size_t nDataSize;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  pCVar6 = g_pCtx;
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pReturn != (CNscPStackEntry *)0x0) {
      pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar3 = (CNscPStackEntry *)(pReturn->m_link).m_pNext;
      if (pCVar3 != pReturn) {
        pCVar5 = (pReturn->m_link).m_pPrev;
        (pCVar3->m_link).m_pPrev = pCVar5;
        pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar3;
        (pReturn->m_link).m_pNext = &pReturn->m_link;
      }
      pCVar5 = &pCVar6->m_listEntryFree;
      if ((CNscPStackEntry *)pCVar5 == pReturn) {
        pCVar5 = pCVar2;
      }
      pCVar2 = pCVar5->m_pNext;
      (pReturn->m_link).m_pNext = pCVar2;
      (pReturn->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = &pReturn->m_link;
      pCVar2->m_pPrev = &pReturn->m_link;
    }
    if (this->m_nType == NscType_Unknown) {
      return this;
    }
LAB_001524d0:
    __assert_fail("m_nType == NscType_Unknown",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0xee,"void CNscPStackEntry::SetType(NscType)");
  }
  if (pReturn == (CNscPStackEntry *)0x0) {
    nDataSize = 0;
    pauchData = (uchar *)0x0;
    nType = NscType_Unknown;
  }
  else {
    nType = pReturn->m_nType;
    if (nType == NscType_Error) {
      if (this->m_nType != NscType_Unknown) goto LAB_001524d0;
      this->m_nType = NscType_Error;
      goto LAB_00152482;
    }
    pauchData = pReturn->m_pauchData;
    nDataSize = pReturn->m_nDataSize;
    if (nDataSize == 0) {
      nType = NscType_Unknown;
    }
  }
  nMessage = NscMessage_ErrorReturnOutsideFunction;
  for (pNVar4 = g_pCtx->m_pCurrentFence; pNVar4 != (NscSymbolFence *)0x0; pNVar4 = pNVar4->pNext) {
    if (pNVar4->nFnSymbol != 0) {
      NVar1 = *(NscType *)((g_pCtx->m_sSymbols).m_pauchData + pNVar4->nFnSymbol + 0x20);
      if ((((nType != NscType_Unknown) ||
           (nMessage = NscMessage_ErrorReturnValueExpected, NVar1 == NscType_Void)) &&
          ((nType == NscType_Unknown ||
           (nMessage = NscMessage_ErrorReturnValueIllegalOnVoidFn, NVar1 != NscType_Void)))) &&
         ((nType == NVar1 ||
          (nMessage = NscMessage_ErrorTypeMismatchOnReturn, NVar1 == NscType_Void))))
      goto LAB_00152440;
      break;
    }
  }
  CNscContext::GenerateMessage(g_pCtx,nMessage);
LAB_00152440:
  CNscPStackEntry::PushReturn(this,nType,pauchData,nDataSize);
  if (g_pCtx->m_fOptReturn == true) {
    if (this->m_nType != NscType_Unknown) goto LAB_001524d0;
  }
  else {
    if (this->m_nType != NscType_Unknown) goto LAB_001524d0;
    this->m_nType = nType;
  }
  NscSetFenceReturn(true);
  pCVar6 = g_pCtx;
  if (pReturn == (CNscPStackEntry *)0x0) {
    return this;
  }
LAB_00152482:
  pCVar2 = (pCVar6->m_listEntryFree).m_pPrev;
  pCVar3 = (CNscPStackEntry *)(pReturn->m_link).m_pNext;
  if (pCVar3 != pReturn) {
    pCVar5 = (pReturn->m_link).m_pPrev;
    (pCVar3->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar3;
    (pReturn->m_link).m_pNext = &pReturn->m_link;
  }
  pCVar5 = &pCVar6->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar6->m_listEntryFree == pReturn) {
    pCVar5 = pCVar2;
  }
  pCVar2 = pCVar5->m_pNext;
  (pReturn->m_link).m_pNext = pCVar2;
  (pReturn->m_link).m_pPrev = pCVar5;
  pCVar5->m_pNext = &pReturn->m_link;
  pCVar2->m_pPrev = &pReturn->m_link;
  return this;
}

Assistant:

YYSTYPE NscBuildReturn (YYSTYPE pReturn)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pReturn)
			g_pCtx ->FreePStackEntry (pReturn);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}

	//
	// Check for silent errors
	//

	if (pReturn != NULL && pReturn ->GetType () == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, normal processing
	//

	else
	{

		//
		// Get the data
		//

		unsigned char *pauchData = NULL;
		size_t nDataSize = 0;
		if (pReturn)
		{
			pauchData = pReturn ->GetData ();
			nDataSize = pReturn ->GetDataSize ();
		} 

		//
		// Get the return type
		//

		NscType nType;
		if (nDataSize > 0)
			nType = pReturn ->GetType ();
		else
			nType = NscType_Unknown;

		//
		// Get the return type of the function
		//

		NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
		while (pFence && pFence ->nFnSymbol == 0)
			pFence = pFence ->pNext;
		if (pFence)
		{
			NscSymbol *pSymbol = g_pCtx ->GetSymbol (pFence ->nFnSymbol);
			if (pSymbol ->nType != NscType_Void && nType == NscType_Unknown)
			{
				g_pCtx ->GenerateMessage (NscMessage_ErrorReturnValueExpected);
			}
			else if (pSymbol ->nType == NscType_Void && nType != NscType_Unknown)
			{
				g_pCtx ->GenerateMessage (
					NscMessage_ErrorReturnValueIllegalOnVoidFn);
			}
			else if (pSymbol ->nType != NscType_Void && nType != pSymbol ->nType)
			{
				g_pCtx ->GenerateMessage (NscMessage_ErrorTypeMismatchOnReturn);
			}
		}
		else
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorReturnOutsideFunction);
		}

		//
		// Push the return
		//

		pOut ->PushReturn (nType, pauchData, nDataSize);
		if (g_pCtx ->GetOptReturn ())
        	pOut ->SetType (NscType_Unknown);
		else
        	pOut ->SetType (nType);

		//
		// Set the fence
		//

		NscSetFenceReturn (true);
	}

	//
	// Return results
	//

	if (pReturn)
        g_pCtx ->FreePStackEntry (pReturn);
	return pOut;
}